

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateModuleGlobalVariables(ExpressionTranslateContext *ctx)

{
  VariableData *variable_00;
  uint uVar1;
  VariableData **ppVVar2;
  TypeRef *pTVar3;
  ScopeData *pSVar4;
  bool local_6d;
  InplaceStr local_68;
  InplaceStr local_58;
  undefined1 local_48 [8];
  InplaceStr name;
  TypeClass *typeClass;
  TypeRef *typeRef;
  bool isInternalFunctionContext;
  VariableData *variable;
  uint i;
  ExpressionTranslateContext *ctx_local;
  
  PrintIndentedLine(ctx,"// Global variables");
  for (variable._4_4_ = 0; uVar1 = SmallArray<VariableData_*,_128U>::size(&ctx->ctx->variables),
      variable._4_4_ < uVar1; variable._4_4_ = variable._4_4_ + 1) {
    ppVVar2 = SmallArray<VariableData_*,_128U>::operator[](&ctx->ctx->variables,variable._4_4_);
    variable_00 = *ppVVar2;
    if (((variable_00->isVmAlloca & 1U) == 0) && (variable_00->type != ctx->ctx->typeVoid)) {
      typeRef._7_1_ = 0;
      pTVar3 = getType<TypeRef>(variable_00->type);
      if ((pTVar3 != (TypeRef *)0x0) &&
         (name.end = (char *)getType<TypeClass>(pTVar3->subType),
         (TypeClass *)name.end != (TypeClass *)0x0)) {
        typeRef._7_1_ = ((TypeClass *)name.end)->isInternal & 1;
      }
      local_48 = (undefined1  [8])(variable_00->name->name).begin;
      name.begin = (variable_00->name->name).end;
      if (variable_00->importModule == (ModuleData *)0x0) {
        uVar1 = InplaceStr::length((InplaceStr *)local_48);
        local_6d = false;
        if (4 < uVar1) {
          InplaceStr::InplaceStr(&local_58,(char *)local_48,(char *)((long)local_48 + 5));
          InplaceStr::InplaceStr(&local_68,"$temp");
          local_6d = InplaceStr::operator==(&local_58,&local_68);
        }
        if (local_6d == false) {
          if ((variable_00->scope == ctx->ctx->globalScope) ||
             (variable_00->scope->ownerNamespace != (NamespaceData *)0x0)) {
            if (typeRef._7_1_ != 0) {
              Print(ctx,"static ");
            }
            TranslateTypeName(ctx,variable_00->type);
            Print(ctx," ");
            TranslateVariableName(ctx,variable_00);
            Print(ctx,";");
            PrintLine(ctx);
          }
          else {
            pSVar4 = ExpressionContext::GlobalScopeFrom(ctx->ctx,variable_00->scope);
            if (pSVar4 != (ScopeData *)0x0) {
              Print(ctx,"static ");
              TranslateTypeName(ctx,variable_00->type);
              Print(ctx," ");
              TranslateVariableName(ctx,variable_00);
              Print(ctx,";");
              PrintLine(ctx);
            }
          }
        }
        else {
          Print(ctx,"static ");
          TranslateTypeName(ctx,variable_00->type);
          Print(ctx," ");
          TranslateVariableName(ctx,variable_00);
          Print(ctx,";");
          PrintLine(ctx);
        }
      }
      else if (typeRef._7_1_ == 0) {
        Print(ctx,"extern ");
        TranslateTypeName(ctx,variable_00->type);
        Print(ctx," ");
        TranslateVariableName(ctx,variable_00);
        Print(ctx,";");
        PrintLine(ctx);
      }
    }
  }
  PrintLine(ctx);
  return;
}

Assistant:

void TranslateModuleGlobalVariables(ExpressionTranslateContext &ctx)
{
	PrintIndentedLine(ctx, "// Global variables");

	for(unsigned int i = 0; i < ctx.ctx.variables.size(); i++)
	{
		VariableData *variable = ctx.ctx.variables[i];

		// Don't need variables allocated by intermediate vm compilation
		if(variable->isVmAlloca)
			continue;

		if(variable->type == ctx.ctx.typeVoid)
			continue;

		bool isInternalFunctionContext = false;

		if(TypeRef *typeRef = getType<TypeRef>(variable->type))
		{
			if(TypeClass *typeClass = getType<TypeClass>(typeRef->subType))
				isInternalFunctionContext = typeClass->isInternal;
		}

		InplaceStr name = variable->name->name;

		if(variable->importModule)
		{
			// Skip internal function context
			if(isInternalFunctionContext)
				continue;

			Print(ctx, "extern ");
			TranslateTypeName(ctx, variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, variable);
			Print(ctx, ";");
			PrintLine(ctx);
		}
		else if(name.length() >= 5 && InplaceStr(name.begin, name.begin + 5) == InplaceStr("$temp"))
		{
			Print(ctx, "static ");
			TranslateTypeName(ctx, variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, variable);
			Print(ctx, ";");
			PrintLine(ctx);
		}
		else if(variable->scope == ctx.ctx.globalScope || variable->scope->ownerNamespace)
		{
			// Do not export internal function context
			if(isInternalFunctionContext)
				Print(ctx, "static ");

			TranslateTypeName(ctx, variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, variable);
			Print(ctx, ";");
			PrintLine(ctx);
		}
		else if(ctx.ctx.GlobalScopeFrom(variable->scope))
		{
			Print(ctx, "static ");
			TranslateTypeName(ctx, variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, variable);
			Print(ctx, ";");
			PrintLine(ctx);
		}
	}

	PrintLine(ctx);
}